

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

string * __thiscall ptTy::dbgTxt_abi_cxx11_(ptTy *this)

{
  undefined8 *in_RSI;
  string *in_RDI;
  char buf [100];
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  snprintf(&stack0xffffffffffffff88,100,"%7.5f, %7.5f",in_RSI[1],*in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  return in_RDI;
}

Assistant:

std::string ptTy::dbgTxt () const
{
    char buf[100];
    snprintf(buf, sizeof(buf), "%7.5f, %7.5f", y, x);
    return std::string(buf);
}